

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::ZeroCopyInputStream::ReadCord(ZeroCopyInputStream *this,Cord *cord,int count)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  CordRepFlat *pCVar4;
  pointer pcVar5;
  size_t sVar6;
  Span<char> SVar7;
  CordBuffer cord_buffer;
  Span<const_char> in;
  void *buffer;
  anon_class_16_2_401397fb CopyBytes;
  anon_class_24_3_65f58981 AppendFullBuffer;
  int local_cc;
  anon_union_16_2_b9f6da03_for_Rep_1 local_c8;
  int local_b4;
  Cord *local_b0;
  Span<char> local_a8;
  anon_union_16_2_b9f6da03_for_Rep_1 local_98;
  anon_union_16_2_b9f6da03_for_Rep_1 local_88;
  Span<const_char> local_70;
  pointer local_60;
  anon_class_16_2_401397fb local_58;
  anon_class_24_3_65f58981 local_48;
  
  if (count < 1) {
    bVar1 = true;
  }
  else {
    uVar3 = (ulong)(cord->contents_).data_.rep_.field_0.data[0];
    if ((uVar3 & 1) == 0) {
      uVar3 = uVar3 >> 1;
    }
    else {
      uVar3 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    local_cc = count;
    local_b0 = cord;
    if (uVar3 == 0) {
      if ((uint)count < 0x10) {
        local_c8.short_rep.raw_size = 1;
        local_c8._1_7_ = 0;
        local_c8.short_rep.data[7] = '\0';
        local_c8._9_7_ = 0;
      }
      else {
        pCVar4 = absl::lts_20240722::cord_internal::CordRepFlat::NewImpl<4096ul>((ulong)(uint)count)
        ;
        (pCVar4->super_CordRep).length = 0;
        local_c8.short_rep.raw_size = (char)pCVar4;
        local_c8._1_7_ = (undefined7)((ulong)pCVar4 >> 8);
      }
    }
    else {
      absl::lts_20240722::Cord::GetAppendBufferSlowPath((ulong)&local_c8,(ulong)cord,0);
    }
    uVar3 = (ulong)local_cc;
    if ((local_c8.short_rep.raw_size & 1U) == 0) {
      SVar7 = absl::lts_20240722::CordBuffer::Rep::long_available((Rep *)&local_c8.long_rep);
    }
    else {
      SVar7 = absl::lts_20240722::CordBuffer::Rep::short_available((Rep *)&local_c8.long_rep);
    }
    if (SVar7.len_ < uVar3) {
      uVar3 = SVar7.len_;
    }
    local_a8.len_ = uVar3;
    local_a8.ptr_ = SVar7.ptr_;
    local_48.cord = &local_b0;
    local_58.cord_buffer = (CordBuffer *)&local_c8;
    local_58.count = &local_cc;
    local_48.cord_buffer = local_58.cord_buffer;
    local_48.count = local_58.count;
    do {
      iVar2 = (*this->_vptr_ZeroCopyInputStream[2])(this,&local_60,&local_b4);
      sVar6 = 0;
      pcVar5 = (pointer)0x0;
      if ((char)iVar2 != '\0') {
        if (local_cc < local_b4) {
          (*this->_vptr_ZeroCopyInputStream[3])(this);
          local_b4 = local_cc;
        }
        sVar6 = (size_t)local_b4;
        pcVar5 = local_60;
      }
      bVar1 = sVar6 != 0;
      local_70.ptr_ = pcVar5;
      local_70.len_ = sVar6;
      if (sVar6 == 0) {
        local_98.long_rep.rep = (CordRepFlat *)CONCAT71(local_c8._1_7_,local_c8.short_rep.raw_size);
        local_98.long_rep.padding = (void *)CONCAT71(local_c8._9_7_,local_c8.short_rep.data[7]);
        local_c8.short_rep.raw_size = 1;
        absl::lts_20240722::Cord::Append(local_b0,(CordBuffer *)&local_98.long_rep);
        if (((ulong)local_98.long_rep.rep & 1) == 0) {
          absl::lts_20240722::cord_internal::CordRepFlat::Delete
                    (&(local_98.long_rep.rep)->super_CordRep);
        }
      }
      else {
        if (local_a8.len_ == 0) {
          local_a8 = ReadCord::anon_class_24_3_65f58981::operator()(&local_48);
        }
        while (local_a8.len_ < local_70.len_) {
          ReadCord::anon_class_16_2_401397fb::operator()
                    (&local_58,&local_a8,&local_70,local_a8.len_);
          local_a8 = ReadCord::anon_class_24_3_65f58981::operator()(&local_48);
        }
        ReadCord::anon_class_16_2_401397fb::operator()(&local_58,&local_a8,&local_70,local_70.len_);
      }
      if (sVar6 == 0) goto LAB_0016a2bb;
    } while (0 < local_cc);
    local_88.long_rep.rep = (CordRepFlat *)CONCAT71(local_c8._1_7_,local_c8.short_rep.raw_size);
    local_88.long_rep.padding = (void *)CONCAT71(local_c8._9_7_,local_c8.short_rep.data[7]);
    local_c8.short_rep.raw_size = 1;
    absl::lts_20240722::Cord::Append(local_b0,(CordBuffer *)&local_88.long_rep);
    if (((ulong)local_88.long_rep.rep & 1) == 0) {
      absl::lts_20240722::cord_internal::CordRepFlat::Delete
                (&(local_88.long_rep.rep)->super_CordRep);
    }
LAB_0016a2bb:
    if ((local_c8.short_rep.raw_size & 1U) == 0) {
      absl::lts_20240722::cord_internal::CordRepFlat::Delete
                ((CordRep *)CONCAT71(local_c8._1_7_,local_c8.short_rep.raw_size));
    }
  }
  return bVar1;
}

Assistant:

bool ZeroCopyInputStream::ReadCord(absl::Cord* cord, int count) {
  if (count <= 0) return true;

  absl::CordBuffer cord_buffer = cord->GetAppendBuffer(count);
  absl::Span<char> out = cord_buffer.available_up_to(count);

  auto FetchNextChunk = [&]() -> absl::Span<const char> {
    const void* buffer;
    int size;
    if (!Next(&buffer, &size)) return {};

    if (size > count) {
      BackUp(size - count);
      size = count;
    }
    return absl::MakeConstSpan(static_cast<const char*>(buffer), size);
  };

  auto AppendFullBuffer = [&]() -> absl::Span<char> {
    cord->Append(std::move(cord_buffer));
    cord_buffer = absl::CordBuffer::CreateWithDefaultLimit(count);
    return cord_buffer.available_up_to(count);
  };

  auto CopyBytes = [&](absl::Span<char>& dst, absl::Span<const char>& src,
                       size_t bytes) {
    memcpy(dst.data(), src.data(), bytes);
    dst.remove_prefix(bytes);
    src.remove_prefix(bytes);
    count -= bytes;
    cord_buffer.IncreaseLengthBy(bytes);
  };

  do {
    absl::Span<const char> in = FetchNextChunk();
    if (in.empty()) {
      // Append whatever we have pending so far.
      cord->Append(std::move(cord_buffer));
      return false;
    }

    if (out.empty()) out = AppendFullBuffer();

    while (in.size() > out.size()) {
      CopyBytes(out, in, out.size());
      out = AppendFullBuffer();
    }

    CopyBytes(out, in, in.size());
  } while (count > 0);

  cord->Append(std::move(cord_buffer));
  return true;
}